

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O2

transformations_t *
opengv::absolute_pose::p3p_kneip
          (transformations_t *__return_storage_ptr__,AbsoluteAdapterBase *adapter,size_t index0,
          size_t index1,size_t index2)

{
  points_t p;
  bearingVectors_t f;
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_78;
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_58;
  Matrix<double,_3,_1,_0,_3,_1> local_40;
  
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (*adapter->_vptr_AbsoluteAdapterBase[2])(&local_78);
  std::
  vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
  ::emplace_back<Eigen::Matrix<double,3,1,0,3,1>>
            ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
              *)&local_58,(Matrix<double,_3,_1,_0,_3,_1> *)&local_78);
  (*adapter->_vptr_AbsoluteAdapterBase[2])(&local_78,adapter,index1);
  std::
  vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
  ::emplace_back<Eigen::Matrix<double,3,1,0,3,1>>
            ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
              *)&local_58,(Matrix<double,_3,_1,_0,_3,_1> *)&local_78);
  (*adapter->_vptr_AbsoluteAdapterBase[2])(&local_78,adapter,index2);
  std::
  vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
  ::emplace_back<Eigen::Matrix<double,3,1,0,3,1>>
            ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
              *)&local_58,(Matrix<double,_3,_1,_0,_3,_1> *)&local_78);
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (*adapter->_vptr_AbsoluteAdapterBase[6])(&local_40,adapter,index0);
  std::
  vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
  ::emplace_back<Eigen::Matrix<double,3,1,0,3,1>>
            ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
              *)&local_78,&local_40);
  (*adapter->_vptr_AbsoluteAdapterBase[6])(&local_40,adapter,index1);
  std::
  vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
  ::emplace_back<Eigen::Matrix<double,3,1,0,3,1>>
            ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
              *)&local_78,&local_40);
  (*adapter->_vptr_AbsoluteAdapterBase[6])(&local_40,adapter,index2);
  std::
  vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
  ::emplace_back<Eigen::Matrix<double,3,1,0,3,1>>
            ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
              *)&local_78,&local_40);
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  modules::p3p_kneip_main
            ((bearingVectors_t *)&local_58,(points_t *)&local_78,__return_storage_ptr__);
  std::
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~_Vector_base(&local_78);
  std::
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~_Vector_base(&local_58);
  return __return_storage_ptr__;
}

Assistant:

opengv::transformations_t
opengv::absolute_pose::p3p_kneip(
    const AbsoluteAdapterBase & adapter,
    size_t index0,
    size_t index1,
    size_t index2)
{
  bearingVectors_t f;
  f.push_back(adapter.getBearingVector(index0));
  f.push_back(adapter.getBearingVector(index1));
  f.push_back(adapter.getBearingVector(index2));
  points_t p;
  p.push_back(adapter.getPoint(index0));
  p.push_back(adapter.getPoint(index1));
  p.push_back(adapter.getPoint(index2));
  transformations_t solutions;
  modules::p3p_kneip_main( f, p, solutions );
  return solutions;
}